

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O3

void __thiscall
Assimp::ObjFileParser::getVector3
          (ObjFileParser *this,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array)

{
  char *pBuffer;
  pointer *ppaVar1;
  iterator __position;
  byte *pbVar2;
  byte *pbVar3;
  float fVar4;
  float fVar5;
  byte *pbVar6;
  ai_real ret;
  aiVector3t<float> local_34;
  
  pBuffer = this->m_buffer;
  copyNextWord(this,pBuffer,0x1000);
  local_34.x = 0.0;
  fast_atoreal_move<float>(pBuffer,&local_34.x,true);
  fVar4 = local_34.x;
  copyNextWord(this,pBuffer,0x1000);
  local_34.x = 0.0;
  fast_atoreal_move<float>(pBuffer,&local_34.x,true);
  fVar5 = local_34.x;
  copyNextWord(this,pBuffer,0x1000);
  local_34.x = 0.0;
  fast_atoreal_move<float>(pBuffer,&local_34.x,true);
  local_34.y = fVar5;
  local_34.z = local_34.x;
  __position._M_current =
       (point3d_array->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (point3d_array->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_34.x = fVar4;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)point3d_array,
               __position,&local_34);
  }
  else {
    (__position._M_current)->z = local_34.x;
    (__position._M_current)->x = fVar4;
    (__position._M_current)->y = fVar5;
    ppaVar1 = &(point3d_array->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  pbVar6 = (byte *)(this->m_DataIt)._M_current;
  pbVar2 = (byte *)(this->m_DataItEnd)._M_current;
  if (pbVar2 + -1 != pbVar6 && pbVar6 != pbVar2) {
    do {
      if (((*pbVar6 < 0xe) && ((0x3401U >> (*pbVar6 & 0x1f) & 1) != 0)) ||
         (pbVar6 = pbVar6 + 1, pbVar6 == pbVar2)) break;
    } while (pbVar6 != pbVar2 + -1);
  }
  pbVar3 = pbVar6;
  if (pbVar6 != pbVar2) {
    pbVar6 = pbVar6 + 1;
    this->m_uiLine = this->m_uiLine + 1;
    pbVar3 = pbVar6;
  }
  for (; (pbVar3 != pbVar2 && ((*pbVar3 == 0x20 || (pbVar6 = pbVar3, *pbVar3 == 9))));
      pbVar3 = pbVar3 + 1) {
    pbVar6 = pbVar2;
  }
  (this->m_DataIt)._M_current = (char *)pbVar6;
  return;
}

Assistant:

void ObjFileParser::getVector3( std::vector<aiVector3D> &point3d_array ) {
    ai_real x, y, z;
    copyNextWord(m_buffer, Buffersize);
    x = (ai_real) fast_atof(m_buffer);

    copyNextWord(m_buffer, Buffersize);
    y = (ai_real) fast_atof(m_buffer);

    copyNextWord( m_buffer, Buffersize );
    z = ( ai_real ) fast_atof( m_buffer );

    point3d_array.push_back( aiVector3D( x, y, z ) );
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}